

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O0

int secp256k1_ec_commit_tweak
              (uchar *tweak32,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,size_t data_size)

{
  int iVar1;
  uchar rbuf [33];
  secp256k1_ge *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  secp256k1_sha256 *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  iVar1 = secp256k1_ec_commit_pubkey_serialize_const(in_stack_ffffffffffffffa8,(uchar *)0x10f4ba);
  if (iVar1 != 0) {
    secp256k1_sha256_write
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    secp256k1_sha256_write
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    secp256k1_sha256_finalize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int secp256k1_ec_commit_tweak(unsigned char *tweak32, secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size)
{
    unsigned char rbuf[33];

    if (!secp256k1_ec_commit_pubkey_serialize_const(pubp, rbuf)) {
        return 0;
    }
    secp256k1_sha256_write(sha, rbuf, sizeof(rbuf));
    secp256k1_sha256_write(sha, data, data_size);
    secp256k1_sha256_finalize(sha, tweak32);
    return 1;
}